

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

void __thiscall btSoftBody::updateNormals(btSoftBody *this)

{
  undefined8 *puVar1;
  uint uVar2;
  Face *pFVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  btScalar bVar8;
  btVector3 bVar9;
  btVector3 n;
  btVector3 local_50;
  btVector3 local_40;
  
  uVar2 = (this->m_nodes).m_size;
  uVar4 = 0;
  uVar6 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar6 = uVar4;
  }
  for (; uVar6 * 0x78 - uVar4 != 0; uVar4 = uVar4 + 0x78) {
    puVar1 = (undefined8 *)((long)(((this->m_nodes).m_data)->m_n).m_floats + uVar4);
    *puVar1 = 0;
    puVar1[1] = 0;
  }
  uVar2 = (this->m_faces).m_size;
  uVar4 = 0;
  uVar6 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar6 = uVar4;
  }
  for (; uVar6 * 0x48 - uVar4 != 0; uVar4 = uVar4 + 0x48) {
    pFVar3 = (this->m_faces).m_data;
    local_40 = operator-((btVector3 *)(*(long *)((long)pFVar3->m_n + uVar4 + 8) + 0x10),
                         (btVector3 *)(*(long *)((long)pFVar3->m_n + uVar4) + 0x10));
    local_50 = operator-((btVector3 *)(*(long *)((long)pFVar3->m_n + uVar4 + 0x10) + 0x10),
                         (btVector3 *)(*(long *)((long)pFVar3->m_n + uVar4) + 0x10));
    n = btVector3::cross(&local_40,&local_50);
    bVar9 = btVector3::normalized(&n);
    *(btScalar (*) [4])((long)(pFVar3->m_normal).m_floats + uVar4) = bVar9.m_floats;
    btVector3::operator+=((btVector3 *)(*(long *)((long)pFVar3->m_n + uVar4) + 0x50),&n);
    btVector3::operator+=((btVector3 *)(*(long *)((long)pFVar3->m_n + uVar4 + 8) + 0x50),&n);
    btVector3::operator+=((btVector3 *)(*(long *)((long)pFVar3->m_n + uVar4 + 0x10) + 0x50),&n);
  }
  uVar2 = (this->m_nodes).m_size;
  uVar6 = 0;
  if (0 < (int)uVar2) {
    uVar6 = (ulong)uVar2;
  }
  lVar5 = 0x50;
  while (bVar7 = uVar6 != 0, uVar6 = uVar6 - 1, bVar7) {
    bVar8 = btVector3::length((btVector3 *)
                              ((long)&(((Node *)(&((this->m_nodes).m_data)->m_x + -1))->
                                      super_Feature).super_Element.m_tag + lVar5));
    n.m_floats[0] = bVar8;
    if (1.1920929e-07 < bVar8) {
      btVector3::operator/=
                ((btVector3 *)
                 ((long)&(((Node *)(&((this->m_nodes).m_data)->m_x + -1))->super_Feature).
                         super_Element.m_tag + lVar5),n.m_floats);
    }
    lVar5 = lVar5 + 0x78;
  }
  return;
}

Assistant:

void					btSoftBody::updateNormals()
{

	const btVector3	zv(0,0,0);
	int i,ni;

	for(i=0,ni=m_nodes.size();i<ni;++i)
	{
		m_nodes[i].m_n=zv;
	}
	for(i=0,ni=m_faces.size();i<ni;++i)
	{
		btSoftBody::Face&	f=m_faces[i];
		const btVector3		n=btCross(f.m_n[1]->m_x-f.m_n[0]->m_x,
			f.m_n[2]->m_x-f.m_n[0]->m_x);
		f.m_normal=n.normalized();
		f.m_n[0]->m_n+=n;
		f.m_n[1]->m_n+=n;
		f.m_n[2]->m_n+=n;
	}
	for(i=0,ni=m_nodes.size();i<ni;++i)
	{
		btScalar len = m_nodes[i].m_n.length();
		if (len>SIMD_EPSILON)
			m_nodes[i].m_n /= len;
	}
}